

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::
coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<int,false,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          it,size_t *out)

{
  ulong uVar1;
  size_t sVar2;
  runtime_error *this_00;
  ulong dimension;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  *out = 0;
  if (*(long *)this != 0) {
    dimension = 0;
    do {
      if (*(ulong *)(this + 0x28) <= dimension) {
        return;
      }
      uVar1 = it._M_current[dimension];
      sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this,dimension);
      if (sVar2 <= uVar1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_0022caac;
      }
      if (*(ulong *)(this + 0x28) <= dimension) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_0022caac;
      }
      *out = *out + *(long *)(*(long *)(this + 0x18) + dimension * 8) * it._M_current[dimension];
      dimension = dimension + 1;
    } while (*(long *)this != 0);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0022caac:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void 
View<T, isConst, A>::coordinatesToIndex
(
    CoordinateIterator it,
    std::size_t& out
) const
{
    testInvariant();
    out = 0;
    for(std::size_t j=0; j<this->dimension(); ++j, ++it) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || static_cast<std::size_t>(*it) < shape(j));
        out += static_cast<std::size_t>(*it) * geometry_.shapeStrides(j);
    }
}